

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O2

void __thiscall QPDFWriter::generateObjectStreams(QPDFWriter *this)

{
  int iVar1;
  ulong uVar2;
  Object *pOVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  QPDFObjGen *item;
  pointer pQVar7;
  ulong uVar8;
  QPDFObjectHandle QStack_58;
  vector<QPDFObjGen,_std::allocator<QPDFObjGen>_> eligible;
  
  QPDF::getCompressibleObjVector
            (&eligible,
             ((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->pdf);
  uVar8 = ((long)eligible.super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)eligible.super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3) + 99;
  uVar2 = uVar8 / 100;
  initializeTables(this,uVar2 * 2);
  if (uVar8 < 100) {
    (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->obj).
    streams_empty = true;
  }
  else {
    uVar4 = (long)eligible.super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)eligible.super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    uVar8 = uVar4 / uVar2;
    QPDF::newIndirectNull((QPDF *)&QStack_58);
    iVar1 = QPDFObjectHandle::getObjectID(&QStack_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&QStack_58.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    uVar6 = 0;
    for (pQVar7 = eligible.super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>._M_impl.
                  super__Vector_impl_data._M_start; iVar5 = (int)uVar6,
        pQVar7 != eligible.super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>._M_impl.
                  super__Vector_impl_data._M_finish; pQVar7 = pQVar7 + 1) {
      if (uVar8 + (uVar2 * uVar8 < uVar4) == uVar6) {
        QPDF::newIndirectNull((QPDF *)&QStack_58);
        iVar1 = QPDFObjectHandle::getObjectID(&QStack_58);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&QStack_58.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        iVar5 = 0;
      }
      pOVar3 = ObjTable<QPDFWriter::Object>::operator[]
                         (&(((this->m).
                             super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->obj).super_ObjTable<QPDFWriter::Object>,*pQVar7);
      pOVar3->object_stream = iVar1;
      pOVar3->gen = pQVar7->gen;
      uVar6 = (ulong)(iVar5 + 1);
    }
  }
  std::_Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>::~_Vector_base
            (&eligible.super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>);
  return;
}

Assistant:

void
QPDFWriter::generateObjectStreams()
{
    // Basic strategy: make a list of objects that can go into an object stream.  Then figure out
    // how many object streams are needed so that we can distribute objects approximately evenly
    // without having any object stream exceed 100 members.  We don't have to worry about linearized
    // files here -- if the file is linearized, we take care of excluding things that aren't allowed
    // here later.

    // This code doesn't do anything with /Extends.

    std::vector<QPDFObjGen> eligible = QPDF::Writer::getCompressibleObjGens(m->pdf);
    size_t n_object_streams = (eligible.size() + 99U) / 100U;

    initializeTables(2U * n_object_streams);
    if (n_object_streams == 0) {
        m->obj.streams_empty = true;
        return;
    }
    size_t n_per = eligible.size() / n_object_streams;
    if (n_per * n_object_streams < eligible.size()) {
        ++n_per;
    }
    unsigned int n = 0;
    int cur_ostream = m->pdf.newIndirectNull().getObjectID();
    for (auto const& item: eligible) {
        if (n == n_per) {
            QTC::TC("qpdf", "QPDFWriter generate >1 ostream");
            n = 0;
            // Construct a new null object as the "original" object stream.  The rest of the code
            // knows that this means we're creating the object stream from scratch.
            cur_ostream = m->pdf.newIndirectNull().getObjectID();
        }
        auto& obj = m->obj[item];
        obj.object_stream = cur_ostream;
        obj.gen = item.getGen();
        ++n;
    }
}